

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::parseVersion(QPDFWriter *this,string *version,int *major,int *minor)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string tmp;
  string local_50 [32];
  ulong local_30;
  size_t p;
  int *minor_local;
  int *major_local;
  string *version_local;
  QPDFWriter *this_local;
  
  p = (size_t)minor;
  minor_local = major;
  major_local = (int *)version;
  version_local = (string *)this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = QUtil::string_to_int(pcVar2);
  *minor_local = iVar1;
  *(undefined4 *)p = 0;
  local_30 = std::__cxx11::string::find((char)major_local,0x2e);
  if ((local_30 != 0xffffffffffffffff) && (uVar3 = std::__cxx11::string::length(), local_30 < uVar3)
     ) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)major_local);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = QUtil::string_to_int(pcVar2);
    *(int *)p = iVar1;
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::to_string(&local_c0,*minor_local);
  std::operator+(&local_a0,&local_c0,".");
  std::__cxx11::to_string(&local_e0,*(int *)p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_a0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)major_local);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void
QPDFWriter::parseVersion(std::string const& version, int& major, int& minor) const
{
    major = QUtil::string_to_int(version.c_str());
    minor = 0;
    size_t p = version.find('.');
    if ((p != std::string::npos) && (version.length() > p)) {
        minor = QUtil::string_to_int(version.substr(p + 1).c_str());
    }
    std::string tmp = std::to_string(major) + "." + std::to_string(minor);
    if (tmp != version) {
        // The version number in the input is probably invalid. This happens with some files that
        // are designed to exercise bugs, such as files in the fuzzer corpus. Unfortunately
        // QPDFWriter doesn't have a way to give a warning, so we just ignore this case.
    }
}